

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.hpp
# Opt level: O1

void __thiscall
tf::
ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
::_check_dependents(ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
                    *this,Pipeflow *pf)

{
  key_type *__k;
  iterator iVar1;
  __node_base_ptr p_Var2;
  vector<unsigned_long,std::allocator<unsigned_long>> *pvVar3;
  _Node_iterator_base<unsigned_long,_false> __it;
  ulong uVar4;
  size_t *__args;
  
  pf->_num_deferrals = pf->_num_deferrals + 1;
  __it._M_cur = (__node_type *)(pf->_dependents)._M_h._M_before_begin._M_nxt;
  if (__it._M_cur != (__node_type *)0x0) {
    __args = &pf->_token;
    do {
      __k = (key_type *)((long)__it._M_cur + 8);
      uVar4 = *(ulong *)((long)__it._M_cur + 8);
      if (uVar4 < this->_num_tokens) {
        p_Var2 = std::
                 _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::_M_find_before_node
                           (&(this->_deferred_tokens)._M_h,
                            uVar4 % (this->_deferred_tokens)._M_h._M_bucket_count,__k,uVar4);
        if ((p_Var2 != (__node_base_ptr)0x0) && (p_Var2->_M_nxt != (_Hash_node_base *)0x0)) {
          pvVar3 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                   std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&this->_token_dependencies,__k);
          iVar1._M_current = *(unsigned_long **)(pvVar3 + 8);
          if (iVar1._M_current == *(unsigned_long **)(pvVar3 + 0x10)) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>(pvVar3,iVar1,__args);
          }
          else {
            *iVar1._M_current = *__args;
            *(unsigned_long **)(pvVar3 + 8) = iVar1._M_current + 1;
          }
          goto LAB_00111ea2;
        }
        __it._M_cur = (__node_type *)
                      std::
                      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      ::erase(&(pf->_dependents)._M_h,__it._M_cur);
      }
      else {
        pvVar3 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                 std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->_token_dependencies,__k);
        iVar1._M_current = *(unsigned_long **)(pvVar3 + 8);
        if (iVar1._M_current == *(unsigned_long **)(pvVar3 + 0x10)) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>(pvVar3,iVar1,__args);
        }
        else {
          *iVar1._M_current = *__args;
          *(unsigned_long **)(pvVar3 + 8) = iVar1._M_current + 1;
        }
        uVar4 = *(ulong *)((long)__it._M_cur + 8);
        if (*(ulong *)((long)__it._M_cur + 8) < this->_longest_deferral) {
          uVar4 = this->_longest_deferral;
        }
        this->_longest_deferral = uVar4;
LAB_00111ea2:
        __it._M_cur = *__it._M_cur;
      }
    } while (__it._M_cur != (__node_type *)0x0);
  }
  return;
}

Assistant:

void ScalablePipeline<P>::_check_dependents(Pipeflow& pf) {
  ++pf._num_deferrals;
  
  for (auto it = pf._dependents.begin(); it != pf._dependents.end();) {
 
    // valid (e.g., 12.defer(16)) 
    if (*it >= _num_tokens) {
      _token_dependencies[*it].push_back(pf._token);
      _longest_deferral = std::max(_longest_deferral, *it);
      ++it;
    }
    // valid or invalid (e.g., 12.defer(7))
    else {
      auto pit = _deferred_tokens.find(*it);
      
      // valid (e.g., 7 is deferred)
      if (pit != _deferred_tokens.end()) {
        _token_dependencies[*it].push_back(pf._token);
        ++it;
      }

      else {
        it = pf._dependents.erase(it);
      }
    }
  }
}